

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_ger_square<double,false>(void)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  quaternion<double> *x;
  pointer pqVar5;
  pointer pqVar6;
  result_type_conflict1 rVar7;
  result_type_conflict1 rVar8;
  result_type_conflict1 rVar9;
  result_type_conflict1 rVar10;
  double ALPHA;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  undefined1 local_2e8 [8];
  undefined8 local_2e0;
  shared_count sStack_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> AC;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  char **local_260;
  quaternion<double> local_258;
  quaternion<double> __r;
  quaternion<double> __r_1;
  quaternion<double> local_1f8;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  for (pqVar6 = X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar5 = Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar6 != X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar6->_M_real = rVar7;
    pqVar6->_M_imag_i = rVar8;
    pqVar6->_M_imag_j = rVar9;
    pqVar6->_M_imag_k = rVar10;
  }
  for (; pqVar6 = A.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pqVar5 != Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar5 = pqVar5 + 1) {
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar5->_M_real = rVar7;
    pqVar5->_M_imag_i = rVar8;
    pqVar5->_M_imag_j = rVar9;
    pqVar5->_M_imag_k = rVar10;
  }
  for (; pqVar6 != A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    rVar7 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar6->_M_real = rVar7;
    pqVar6->_M_imag_i = rVar8;
    pqVar6->_M_imag_j = rVar9;
    pqVar6->_M_imag_k = rVar10;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&AC,&A);
  ALPHA = genRandom<double>();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_1a8,"hblas2_ger ");
  std::operator<<(local_1a8,"u");
  std::operator<<(local_1a8,"_square_");
  std::operator<<(local_1a8,"R");
  HAXX::HBLAS_GERU<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            (100,100,ALPHA,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,
             Y.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 100; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 0xc80; lVar4 = lVar4 + 0x20) {
      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_298 = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0xfc,&local_2b0);
      pdVar1 = (double *)
               ((long)&(X.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar4);
      __r._M_real = ALPHA * *pdVar1;
      __r._M_imag_i = ALPHA * pdVar1[1];
      __r._M_imag_j = ALPHA * pdVar1[2];
      __r._M_imag_k = ALPHA * pdVar1[3];
      HAXX::operator*(&local_1f8,&__r,
                      Y.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
      pdVar1 = (double *)
               ((long)&(AC.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar4 + lVar3);
      __r_1._M_real = *pdVar1 + local_1f8._M_real;
      __r_1._M_imag_i = pdVar1[1] + local_1f8._M_imag_i;
      __r_1._M_imag_j = pdVar1[2] + local_1f8._M_imag_j;
      __r_1._M_imag_k = pdVar1[3] + local_1f8._M_imag_k;
      HAXX::inv<double>(&local_1d8,
                        (quaternion<double> *)
                        ((long)&(A.
                                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar4 + lVar3
                        ));
      HAXX::operator*(&local_258,&__r_1,&local_1d8);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_258._M_imag_i;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_258._M_imag_j;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_258._M_imag_k;
      local_270 = 0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (local_258._M_real + -1.0) * (local_258._M_real + -1.0);
      auVar11 = vfmadd231sd_fma(auVar14,auVar11,auVar11);
      auVar11 = vfmadd231sd_fma(auVar11,auVar12,auVar12);
      auVar11 = vfmadd231sd_fma(auVar11,auVar13,auVar13);
      auVar11 = vsqrtsd_avx(auVar11,auVar11);
      local_2e8[0] = auVar11._0_8_ < 1e-12;
      local_2e0 = 0;
      sStack_2d8.pi_ = (sp_counted_base *)0x0;
      local_2c0 = 
      "( HAXX::norm(((ALPHA*X[i]*Y[j] + AC[( (i) + (j)*(100) )]) * HAXX::inv(A[( (i) + (j)*(100) )]))- 1.) < 1e-12 )"
      ;
      local_2b8 = "";
      local_278 = &PTR__lazy_ostream_00219908;
      local_268 = &boost::unit_test::lazy_ostream::inst;
      local_260 = &local_2c0;
      local_2d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
      local_2c8 = "";
      boost::test_tools::tt_detail::report_assertion(local_2e8,&local_278,&local_2d0,0xfc,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_2d8);
    }
    lVar3 = lVar3 + 0xc80;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&AC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_ger_square() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN), A(HBLAS2_MATLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y)
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> AC(A);

  _AlphaF ALPHA = genRandom<_AlphaF>();

  std::stringstream ss;

  ss << "hblas2_ger ";
  if( _CONJ ) ss << "c";
  else        ss << "u";
  ss << "_square_";
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";

  if( _CONJ )
    HBLAS_GERC(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);
  else
    HBLAS_GERU(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);

  for(int j = 0; j < HBLAS1_VECLEN; j++) 
  for(int i = 0; i < HBLAS1_VECLEN; i++) {

    if( _CONJ )
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*HAXX::conj(Y[j]) + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );
    else
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*Y[j] + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );

  }
}